

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcInstPrinter.c
# Opt level: O1

void printMemOperand(MCInst *MI,uint OpNo,SStream *O)

{
  uint8_t *puVar1;
  byte bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  cs_detail *pcVar5;
  MCOperand *op;
  ulong uVar6;
  undefined8 uVar7;
  long lVar8;
  undefined1 *puVar9;
  undefined4 in_register_00000034;
  char *pcVar10;
  undefined1 *puVar11;
  undefined8 uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  bool bVar16;
  
  op = MCInst_getOperand(MI,1);
  uVar6 = MCOperand_getImm(op);
  uVar13 = (uint)(uVar6 >> 0xc) & 0x7f;
  uVar15 = (uint)(uVar6 >> 5) & 0x7f;
  uVar14 = (uint)(uVar6 >> 1) & 0xf;
  bVar16 = (uVar6 >> 0x13 & 1) == 0;
  uVar7 = 0x5b;
  if (bVar16) {
    uVar7 = 0x28;
  }
  uVar12 = 0x5d;
  if (bVar16) {
    uVar12 = 0x29;
  }
  switch(uVar14) {
  case 0:
    puVar9 = getRegisterName_AsmStrs +
             *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar13 - 1) * 2);
    pcVar10 = "*-%s%c%u%c";
    break;
  case 1:
    puVar9 = getRegisterName_AsmStrs +
             *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar13 - 1) * 2);
    pcVar10 = "*+%s%c%u%c";
    break;
  default:
    goto switchD_0026c2b5_caseD_2;
  case 4:
    puVar9 = getRegisterName_AsmStrs +
             *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar13 - 1) * 2);
    puVar11 = getRegisterName_AsmStrs +
              *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar15 - 1) * 2);
    pcVar10 = "*-%s%c%s%c";
    goto LAB_0026c4c4;
  case 5:
    puVar9 = getRegisterName_AsmStrs +
             *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar13 - 1) * 2);
    puVar11 = getRegisterName_AsmStrs +
              *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar15 - 1) * 2);
    pcVar10 = "*+%s%c%s%c";
    goto LAB_0026c4c4;
  case 8:
    puVar9 = getRegisterName_AsmStrs +
             *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar13 - 1) * 2);
    pcVar10 = "*--%s%c%u%c";
    break;
  case 9:
    puVar9 = getRegisterName_AsmStrs +
             *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar13 - 1) * 2);
    pcVar10 = "*++%s%c%u%c";
    break;
  case 10:
    puVar9 = getRegisterName_AsmStrs +
             *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar13 - 1) * 2);
    pcVar10 = "*%s--%c%u%c";
    break;
  case 0xb:
    puVar9 = getRegisterName_AsmStrs +
             *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar13 - 1) * 2);
    pcVar10 = "*%s++%c%u%c";
    break;
  case 0xc:
    puVar9 = getRegisterName_AsmStrs +
             *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar13 - 1) * 2);
    puVar11 = getRegisterName_AsmStrs +
              *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar15 - 1) * 2);
    pcVar10 = "*--%s%c%s%c";
    goto LAB_0026c4c4;
  case 0xd:
    puVar9 = getRegisterName_AsmStrs +
             *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar13 - 1) * 2);
    puVar11 = getRegisterName_AsmStrs +
              *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar15 - 1) * 2);
    pcVar10 = "*++%s%c%s%c";
    goto LAB_0026c4c4;
  case 0xe:
    puVar9 = getRegisterName_AsmStrs +
             *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar13 - 1) * 2);
    puVar11 = getRegisterName_AsmStrs +
              *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar15 - 1) * 2);
    pcVar10 = "*%s--%c%s%c";
    goto LAB_0026c4c4;
  case 0xf:
    puVar9 = getRegisterName_AsmStrs +
             *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar13 - 1) * 2);
    puVar11 = getRegisterName_AsmStrs +
              *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar15 - 1) * 2);
    pcVar10 = "*%s++%c%s%c";
LAB_0026c4c4:
    SStream_concat((SStream *)CONCAT44(in_register_00000034,OpNo),pcVar10,puVar9,uVar7,puVar11,
                   uVar12);
    goto switchD_0026c2b5_caseD_2;
  }
  SStream_concat((SStream *)CONCAT44(in_register_00000034,OpNo),pcVar10,puVar9,uVar7,(ulong)uVar15,
                 uVar12);
switchD_0026c2b5_caseD_2:
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar5 = MI->flat_insn->detail;
    bVar2 = (pcVar5->field_6).x86.prefix[0];
    lVar8 = (ulong)bVar2 * 0x20;
    puVar1 = pcVar5->groups + lVar8 + 0x11;
    puVar1[0] = '\x03';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(uint *)(pcVar5->groups + lVar8 + 0x15) = uVar13;
    *(uint *)(pcVar5->groups + lVar8 + 0x19) = uVar15;
    *(uint *)(pcVar5->groups + lVar8 + 0x1d) = ((uint)uVar6 & 1) + 1;
    *(uint *)(pcVar5->groups + lVar8 + 0x21) = (uint)(uVar6 >> 0x13) & 1;
    if ((0xff33U >> uVar14 & 1) != 0) {
      uVar6 = (ulong)(uVar14 << 2);
      uVar3 = *(undefined4 *)(&DAT_00598884 + uVar6);
      uVar4 = *(undefined4 *)(&DAT_005988c4 + uVar6);
      lVar8 = (ulong)bVar2 * 0x20;
      *(undefined4 *)(pcVar5->groups + lVar8 + 0x25) = *(undefined4 *)((long)&DAT_00598844 + uVar6);
      *(undefined4 *)(pcVar5->groups + lVar8 + 0x29) = uVar3;
      *(undefined4 *)(pcVar5->groups + lVar8 + 0x2d) = uVar4;
    }
    (pcVar5->field_6).x86.prefix[0] = (pcVar5->field_6).x86.prefix[0] + '\x01';
  }
  return;
}

Assistant:

static void printMemOperand(MCInst *MI, int opNum, SStream *O, const char *Modifier)
{
	MCOperand *MO;

	set_mem_access(MI, true);
	printOperand(MI, opNum, O);

	// If this is an ADD operand, emit it like normal operands.
	if (Modifier && !strcmp(Modifier, "arith")) {
		SStream_concat0(O, ", ");
		printOperand(MI, opNum + 1, O);
		set_mem_access(MI, false);
		return;
	}

	MO = MCInst_getOperand(MI, opNum + 1);

	if (MCOperand_isReg(MO) && (MCOperand_getReg(MO) == SP_G0)) {
		set_mem_access(MI, false);
		return;   // don't print "+%g0"
	}

	if (MCOperand_isImm(MO) && (MCOperand_getImm(MO) == 0)) {
		set_mem_access(MI, false);
		return;   // don't print "+0"
	}

	SStream_concat0(O, "+");	// qq

	printOperand(MI, opNum + 1, O);
	set_mem_access(MI, false);
}